

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O0

void __thiscall rudp::session::update_receive_head(session *this,outiter_t *received)

{
  bool bVar1;
  iterator pvVar2;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *psVar3;
  __shared_ptr *p_Var4;
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  *pvVar5;
  size_type sVar6;
  byte *pbVar7;
  back_insert_iterator<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>
  *pbVar8;
  difference_type dVar9;
  __shared_ptr *p_Var10;
  iterator __last;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> local_a0;
  __shared_ptr *local_90;
  iterator iter_1;
  __shared_ptr *local_78;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *end_iter_1;
  iterator head_iter_1;
  __shared_ptr *local_58;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *iter;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> local_40;
  __shared_ptr *local_30;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *end_iter;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *head_iter;
  outiter_t *poStack_18;
  uint8_t old_receive_head;
  outiter_t *received_local;
  session *this_local;
  
  head_iter._7_1_ = this->receive_head;
  poStack_18 = received;
  received_local = (outiter_t *)this;
  pvVar2 = std::
           array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
           ::begin(&this->receive_buffer);
  psVar3 = std::next<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*>
                     (pvVar2,(ulong)this->receive_head);
  end_iter = psVar3;
  pvVar2 = std::
           array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
           ::end(&this->receive_buffer);
  std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::shared_ptr
            (&local_40);
  p_Var4 = (__shared_ptr *)
           std::
           find<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>>
                     (psVar3,pvVar2,&local_40);
  std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::~shared_ptr
            (&local_40);
  local_30 = p_Var4;
  for (local_58 = (__shared_ptr *)end_iter; psVar3 = end_iter, p_Var4 = local_30,
      local_58 != local_30; local_58 = local_58 + 0x10) {
    if ((local_58 != (__shared_ptr *)0x0) &&
       (bVar1 = std::__shared_ptr::operator_cast_to_bool(local_58), bVar1)) {
      pvVar5 = &std::
                __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_58)->
                super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
      ;
      sVar6 = boost::container::
              vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
              ::size(pvVar5);
      if (2 < sVar6) {
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_58)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        sVar6 = boost::container::
                vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                ::size(pvVar5);
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_58)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        pbVar7 = boost::container::
                 vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                 ::operator[](pvVar5,1);
        p_Var4 = local_58;
        if (*pbVar7 < sVar6) {
          pbVar8 = std::
                   back_insert_iterator<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>
                   ::operator*(poStack_18);
          std::
          back_insert_iterator<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>
          ::operator=(pbVar8,(value_type *)p_Var4);
          std::
          back_insert_iterator<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>
          ::operator++(poStack_18);
        }
      }
    }
  }
  std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::shared_ptr
            ((shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)
             &head_iter_1);
  std::
  fill<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>>
            (psVar3,(shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)
                    p_Var4,
             (shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)
             &head_iter_1);
  std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::~shared_ptr
            ((shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)
             &head_iter_1);
  pvVar2 = std::
           array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
           ::begin(&this->receive_buffer);
  dVar9 = std::
          distance<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*>
                    (pvVar2,(shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>
                             *)local_30);
  p_Var4 = local_30;
  this->receive_head = (uint8_t)dVar9;
  p_Var10 = (__shared_ptr *)
            std::
            array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
            ::end(&this->receive_buffer);
  if (p_Var4 == p_Var10) {
    pvVar2 = std::
             array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
             ::begin(&this->receive_buffer);
    end_iter_1 = pvVar2;
    __last = std::
             array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
             ::end(&this->receive_buffer);
    std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::shared_ptr
              ((shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)&iter_1)
    ;
    p_Var4 = (__shared_ptr *)
             std::
             find<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>>
                       (pvVar2,__last,
                        (shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *
                        )&iter_1);
    std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::~shared_ptr
              ((shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)&iter_1)
    ;
    local_78 = p_Var4;
    for (local_90 = (__shared_ptr *)end_iter_1; psVar3 = end_iter_1, p_Var4 = local_78,
        local_90 != local_78; local_90 = local_90 + 0x10) {
      if ((local_90 != (__shared_ptr *)0x0) &&
         (bVar1 = std::__shared_ptr::operator_cast_to_bool(local_90), bVar1)) {
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_90)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        sVar6 = boost::container::
                vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                ::size(pvVar5);
        if (2 < sVar6) {
          pvVar5 = &std::
                    __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_90)->
                    super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
          ;
          sVar6 = boost::container::
                  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                  ::size(pvVar5);
          pvVar5 = &std::
                    __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_90)->
                    super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
          ;
          pbVar7 = boost::container::
                   vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                   ::operator[](pvVar5,1);
          p_Var4 = local_90;
          if (*pbVar7 < sVar6) {
            pbVar8 = std::
                     back_insert_iterator<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>
                     ::operator*(poStack_18);
            std::
            back_insert_iterator<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>
            ::operator=(pbVar8,(value_type *)p_Var4);
            std::
            back_insert_iterator<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>
            ::operator++(poStack_18);
          }
        }
      }
    }
    std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::shared_ptr
              (&local_a0);
    std::
    fill<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>>
              (psVar3,(shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)
                      p_Var4,&local_a0);
    std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::~shared_ptr
              (&local_a0);
    pvVar2 = std::
             array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
             ::begin(&this->receive_buffer);
    dVar9 = std::
            distance<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*>
                      (pvVar2,(shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>
                               *)local_78);
    this->receive_head = (uint8_t)dVar9;
  }
  if (head_iter._7_1_ == this->receive_head) {
    this->out_of_sequence_count = this->out_of_sequence_count + '\x01';
  }
  else {
    this->out_of_sequence_count = '\0';
  }
  return;
}

Assistant:

void session::update_receive_head( outiter_t &received ) {
    const auto old_receive_head = receive_head;
    const auto head_iter = std::next( receive_buffer.begin(), receive_head );
    const auto end_iter = std::find( head_iter, receive_buffer.end(), buffer_ptr_t() );
    for( auto iter = head_iter; iter != end_iter; ++iter ) {
      if( iter && *iter && (*iter)->size() > 2 && (*iter)->size() > (**iter)[ 1 ] ) {
        *received = *iter;
	       ++received;
      }
    }
    std::fill( head_iter, end_iter, buffer_ptr_t() );
    receive_head = std::distance( receive_buffer.begin(), end_iter );
    if( end_iter == receive_buffer.end() ) {
      const auto head_iter = receive_buffer.begin();
      const auto end_iter = std::find( head_iter, receive_buffer.end(), buffer_ptr_t() );
      for( auto iter = head_iter; iter != end_iter; ++iter ) {
        if( iter && *iter && (*iter)->size() > 2 && (*iter)->size() > (**iter)[ 1 ] ) {
          *received = *iter;
          ++received;
        }
      }
      std::fill( head_iter, end_iter, buffer_ptr_t() );
      receive_head = std::distance( receive_buffer.begin(), end_iter );
    }
    if( old_receive_head == receive_head ) ++out_of_sequence_count;
    else out_of_sequence_count = 0;
  }